

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  uint uVar1;
  int n;
  float *pfVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  if (count != 0) {
    if (count == 1) {
      if (items->Width < 0.0) {
        return;
      }
      fVar4 = items->Width - width_excess;
      if (fVar4 <= 1.0) {
        fVar4 = 1.0;
      }
      items->Width = fVar4;
      return;
    }
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
  }
  uVar1 = 1;
  do {
    if ((count <= (int)uVar1) || (width_excess <= 0.0)) break;
    pfVar2 = &items[(int)uVar1].Width;
    do {
      fVar4 = *pfVar2;
      if (fVar4 < items->Width) {
        if (0.0 <= fVar4) {
          fVar4 = items->Width - fVar4;
          goto LAB_0015dcf4;
        }
        break;
      }
      uVar1 = uVar1 + 1;
      pfVar2 = pfVar2 + 2;
    } while (count != uVar1);
    fVar4 = items->Width + -1.0;
LAB_0015dcf4:
    if (0.0 < fVar4) {
      fVar5 = width_excess / (float)(int)uVar1;
      if (fVar4 <= fVar5) {
        fVar5 = fVar4;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          items[uVar3].Width = items[uVar3].Width - fVar5;
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      width_excess = width_excess - fVar5 * (float)(int)uVar1;
    }
  } while (0.0 < fVar4);
  fVar4 = 0.0;
  if (0 < count) {
    uVar3 = 0;
    do {
      fVar5 = (float)(int)items[uVar3].Width;
      fVar4 = fVar4 + (items[uVar3].Width - fVar5);
      items[uVar3].Width = fVar5;
      uVar3 = uVar3 + 1;
    } while ((uint)count != uVar3);
  }
  if (0 < count && 0.0 < fVar4) {
    uVar3 = 0;
    do {
      if (items[uVar3].Index < (int)(fVar4 + 0.01)) {
        items[uVar3].Width = items[uVar3].Width + 1.0;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)count != uVar3);
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}